

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O2

void __thiscall
slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::visitStmt
          (AbstractFlowAnalysis<TestAnalysis,_int> *this,ConditionalStatement *stmt)

{
  int iVar1;
  int iVar2;
  Condition *cond;
  pointer pCVar3;
  long lVar4;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  _Stack_58;
  
  pCVar3 = (stmt->conditions)._M_ptr;
  iVar2 = 0;
  for (lVar4 = (stmt->conditions)._M_extent._M_extent_value << 4; lVar4 != 0; lVar4 = lVar4 + -0x10)
  {
    visitCondition((ConstantValue *)&_Stack_58,this,(pCVar3->expr).ptr);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage(&_Stack_58);
    if (pCVar3->pattern != (Pattern *)0x0) {
      ast::Pattern::visit<TestAnalysis>(pCVar3->pattern,(TestAnalysis *)this);
    }
    iVar2 = iVar2 + this->stateWhenFalse;
    this->isStateSplit = false;
    this->state = this->stateWhenTrue;
    this->stateWhenTrue = 0;
    this->stateWhenFalse = 0;
    pCVar3 = pCVar3 + 1;
  }
  ast::Statement::visit<TestAnalysis&>(stmt->ifTrue,(TestAnalysis *)this);
  iVar1 = this->state;
  this->isStateSplit = false;
  this->state = iVar2;
  this->stateWhenTrue = 0;
  this->stateWhenFalse = 0;
  if (stmt->ifFalse != (Statement *)0x0) {
    ast::Statement::visit<TestAnalysis&>(stmt->ifFalse,(TestAnalysis *)this);
    iVar2 = this->state;
  }
  this->state = iVar2 + iVar1;
  return;
}

Assistant:

void visitStmt(const ConditionalStatement& stmt) {
        auto falseState = (DERIVED).unreachableState();
        for (auto& cond : stmt.conditions) {
            visitCondition(*cond.expr);

            if (cond.pattern)
                visit(*cond.pattern);

            (DERIVED).joinState(falseState, stateWhenFalse);
            setState(std::move(stateWhenTrue));
        }

        visit(stmt.ifTrue);

        auto trueState = std::move(state);
        setState(std::move(falseState));
        if (stmt.ifFalse)
            visit(*stmt.ifFalse);

        (DERIVED).joinState(state, trueState);
    }